

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_function.c
# Opt level: O0

function_return
function_await(function_conflict func,void **args,size_t size,
              function_resolve_callback resolve_callback,function_reject_callback reject_callback,
              void *context)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 in_R8;
  function_return local_8;
  
  if ((((in_RDI == 0) || (in_RSI == 0)) || (*(long *)(in_RDI + 0x18) == 0)) ||
     (*(long *)(*(long *)(in_RDI + 0x18) + 0x10) == 0)) {
    local_8 = (function_return)0x0;
  }
  else {
    local_8 = (function_return)
              (**(code **)(*(long *)(in_RDI + 0x18) + 0x10))
                        (in_RDI,*(undefined8 *)(in_RDI + 0x10),in_RSI,in_RDX,in_RCX,in_R8);
  }
  return local_8;
}

Assistant:

function_return function_await(function func, function_args args, size_t size, function_resolve_callback resolve_callback, function_reject_callback reject_callback, void *context)
{
	if (func != NULL && args != NULL)
	{
		if (func->interface != NULL && func->interface->await != NULL)
		{
			/* TODO: Disable logs here until log is completely thread safe and async signal safe */

			/*
			if (func->name == NULL)
			{
				log_write("metacall", LOG_LEVEL_DEBUG, "Await annonymous function with args <%p>", (void *)args);
			}
			else
			{
				log_write("metacall", LOG_LEVEL_DEBUG, "Await function (%s) with args <%p>", func->name, (void *)args);
			}
			*/

			return func->interface->await(func, func->impl, args, size, resolve_callback, reject_callback, context);
		}
	}

	return NULL;
}